

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSystemTools.cxx
# Opt level: O2

bool CheckRelativePath(string *local,string *remote,string *expected)

{
  bool bVar1;
  ostream *poVar2;
  string result;
  string local_40;
  
  cmsys::SystemTools::RelativePath(&local_40,local,remote);
  bVar1 = cmsys::SystemTools::ComparePath(expected,&local_40);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"RelativePath(");
    poVar2 = std::operator<<(poVar2,(string *)local);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::operator<<(poVar2,(string *)remote);
    poVar2 = std::operator<<(poVar2,")  yielded ");
    poVar2 = std::operator<<(poVar2,(string *)&local_40);
    poVar2 = std::operator<<(poVar2," instead of ");
    poVar2 = std::operator<<(poVar2,(string *)expected);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return bVar1;
}

Assistant:

static bool CheckRelativePath(const std::string& local,
                              const std::string& remote,
                              const std::string& expected)
{
  std::string result = kwsys::SystemTools::RelativePath(local, remote);
  if (!kwsys::SystemTools::ComparePath(expected, result)) {
    std::cerr << "RelativePath(" << local << ", " << remote << ")  yielded "
              << result << " instead of " << expected << std::endl;
    return false;
  }
  return true;
}